

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::(anonymous_namespace)::BlockSizes_WriteCord_Test::~BlockSizes_WriteCord_Test
          (BlockSizes_WriteCord_Test *this)

{
  io::anon_unknown_0::BlockSizes_WriteCord_Test::~BlockSizes_WriteCord_Test
            ((BlockSizes_WriteCord_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(BlockSizes, WriteCord) {
  int kBlockSizes_case = GetParam();
  ArrayOutputStream output(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedOutputStream coded_output(&output);

    absl::Cord cord(kRawBytes);
    coded_output.WriteCord(cord);
    EXPECT_FALSE(coded_output.HadError());

    EXPECT_EQ(strlen(kRawBytes), coded_output.ByteCount());
  }

  EXPECT_EQ(strlen(kRawBytes), output.ByteCount());
  EXPECT_EQ(0, memcmp(buffer_, kRawBytes, strlen(kRawBytes)));
}